

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::updateLastInputTime(WindowImplX11 *this,Time time)

{
  Atom AVar1;
  allocator<char> local_41;
  string local_40;
  Atom local_20;
  Atom netWmUserTime;
  Time time_local;
  WindowImplX11 *this_local;
  
  if ((time != 0) && (time != this->m_lastInputTime)) {
    netWmUserTime = time;
    time_local = (Time)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"_NET_WM_USER_TIME",&local_41);
    AVar1 = getAtom(&local_40,true);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    if (AVar1 != 0) {
      local_20 = AVar1;
      XChangeProperty(this->m_display,this->m_window,AVar1,6,0x20,0,&netWmUserTime,1);
    }
    this->m_lastInputTime = netWmUserTime;
  }
  return;
}

Assistant:

void WindowImplX11::updateLastInputTime(::Time time)
{
    if (time && (time != m_lastInputTime))
    {
        Atom netWmUserTime = getAtom("_NET_WM_USER_TIME", true);

        if (netWmUserTime)
        {
            XChangeProperty(m_display,
                            m_window,
                            netWmUserTime,
                            XA_CARDINAL,
                            32,
                            PropModeReplace,
                            reinterpret_cast<const unsigned char*>(&time),
                            1);
        }

        m_lastInputTime = time;
    }
}